

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SafeInt.hpp
# Opt level: O0

SafeInt<short,_safeint_exception_handlers::SafeInt_InvalidParameter>
operator%(uchar lhs,SafeInt<short,_safeint_exception_handlers::SafeInt_InvalidParameter> rhs)

{
  bool bVar1;
  SafeInt<unsigned_char,_safeint_exception_handlers::SafeInt_InvalidParameter> SVar2;
  short in_SI;
  uchar in_DIL;
  SafeInt<short,_safeint_exception_handlers::SafeInt_InvalidParameter> result;
  SafeInt<unsigned_char,_safeint_exception_handlers::SafeInt_InvalidParameter>
  *in_stack_ffffffffffffffe8;
  undefined7 in_stack_fffffffffffffff0;
  undefined1 in_stack_fffffffffffffff7;
  uchar local_5;
  SafeInt<short,_safeint_exception_handlers::SafeInt_InvalidParameter> local_4;
  SafeInt<short,_safeint_exception_handlers::SafeInt_InvalidParameter> local_2;
  
  local_5 = in_DIL;
  local_4.m_int = in_SI;
  SafeInt<short,_safeint_exception_handlers::SafeInt_InvalidParameter>::SafeInt(&local_2);
  bVar1 = ModulusSimpleCaseHelper<short,_unsigned_char,_safeint_exception_handlers::SafeInt_InvalidParameter,_0>
          ::ModulusSimpleCase(local_5,local_4,&local_2);
  if (!bVar1) {
    SafeInt<unsigned_char,_safeint_exception_handlers::SafeInt_InvalidParameter>::SafeInt
              ((SafeInt<unsigned_char,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
               &stack0xfffffffffffffff6,&local_5);
    SafeInt::operator_cast_to_short
              ((SafeInt<short,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
               CONCAT17(in_stack_fffffffffffffff7,in_stack_fffffffffffffff0));
    SVar2 = SafeInt<unsigned_char,safeint_exception_handlers::SafeInt_InvalidParameter>::operator%
                      (in_stack_ffffffffffffffe8,0);
    SafeInt<short,safeint_exception_handlers::SafeInt_InvalidParameter>::operator=
              ((SafeInt<short,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
               CONCAT17(SVar2.m_int,in_stack_fffffffffffffff0),in_stack_ffffffffffffffe8);
  }
  return (SafeInt<short,_safeint_exception_handlers::SafeInt_InvalidParameter>)local_2.m_int;
}

Assistant:

SAFEINT_CONSTEXPR14 SafeInt< T, E > operator %( U lhs, SafeInt< T, E > rhs ) SAFEINT_CPP_THROW
{
    // Value of return depends on sign of lhs
    // This one may not be safe - bounds check in constructor
    // if lhs is negative and rhs is unsigned, this will throw an exception.

    // Fast-track the simple case
    // same size and same sign
    SafeInt< T, E > result;

    if( ModulusSimpleCaseHelper< T, U, E, (sizeof(T) == sizeof(U)) && ((bool)std::numeric_limits< T >::is_signed == (bool)std::numeric_limits< U >::is_signed) >::ModulusSimpleCase( lhs, rhs, result ) )
        return result;

    result = (SafeInt< U, E >(lhs) % (T)rhs);
    return result;
}